

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O0

int pospopcnt_u16_scalar_umul128_unroll2(uint16_t *in,uint32_t n,uint32_t *out)

{
  uint64_t uVar1;
  int *in_RDX;
  uint in_ESI;
  ushort *in_RDI;
  uint64_t x;
  uint64_t magic;
  uint64_t mask_01;
  uint64_t tail_counter_b;
  uint64_t tail_counter_a;
  uint64_t hi;
  uint64_t d;
  uint64_t c;
  uint64_t b;
  uint64_t a;
  uint64_t v1;
  uint64_t v0;
  uint64_t mask_cnts;
  uint64_t mask_0001;
  uint64_t mask_c;
  uint64_t mask_b;
  uint64_t mask_a;
  uint16_t *end;
  uint32_t len;
  uint64_t counter_d;
  uint64_t counter_c;
  uint64_t counter_b;
  uint64_t counter_a;
  uint local_d4;
  ulong local_b8;
  ulong local_b0;
  uint64_t local_a8;
  ulong local_a0;
  ulong local_98;
  uint64_t local_90;
  uint64_t local_88;
  uint64_t local_80;
  ulong local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  ushort *local_48;
  uint local_3c;
  ulong local_38;
  ulong local_30;
  ulong local_28;
  ulong local_20;
  int *local_18;
  uint local_c;
  ushort *local_8;
  
  local_18 = in_RDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  while (7 < local_c) {
    local_20 = 0;
    local_28 = 0;
    local_30 = 0;
    local_38 = 0;
    if (local_c < 0xfff) {
      local_d4 = local_c;
    }
    else {
      local_d4 = 0xfff;
    }
    local_3c = local_d4 & 0xfffffff8;
    local_c = local_c - local_3c;
    local_48 = local_8 + local_3c;
    for (; local_8 != local_48; local_8 = local_8 + 8) {
      local_50 = 0x1111111111111111;
      local_58 = 0x2222222222222222;
      local_60 = 0x4444444444444444;
      local_68 = 0x1000100010001;
      local_70 = 0xf00f00f00f;
      local_78 = pospopcnt_loadu_u64(local_8);
      local_80 = pospopcnt_loadu_u64(local_8 + 4);
      local_88 = (local_78 & 0x1111111111111111) + (local_80 & 0x1111111111111111);
      local_90 = (local_78 & 0x2222222222222222) + (local_80 & 0x2222222222222222) >> 1;
      local_98 = (local_78 & 0x4444444444444444) + (local_80 & 0x4444444444444444) >> 2;
      local_a0 = (local_78 >> 3 & 0x1111111111111111) + (local_80 >> 3 & 0x1111111111111111);
      uVar1 = pospopcnt_umul128(local_88,0x1000100010001,&local_a8);
      local_88 = local_a8 + uVar1;
      uVar1 = pospopcnt_umul128(local_90,0x1000100010001,&local_a8);
      local_90 = local_a8 + uVar1;
      uVar1 = pospopcnt_umul128(local_98,0x1000100010001,&local_a8);
      local_98 = local_a8 + uVar1;
      local_a0 = pospopcnt_umul128(local_a0,0x1000100010001,&local_a8);
      local_a0 = local_a8 + local_a0;
      local_20 = (local_88 & 0xf00f00f00f) + local_20;
      local_28 = (local_90 & 0xf00f00f00f) + local_28;
      local_30 = (local_98 & 0xf00f00f00f) + local_30;
      local_38 = (local_a0 & 0xf00f00f00f) + local_38;
    }
    *local_18 = *local_18 + ((uint)local_20 & 0xfff);
    local_18[1] = local_18[1] + ((uint)local_28 & 0xfff);
    local_18[2] = local_18[2] + ((uint)local_30 & 0xfff);
    local_18[3] = local_18[3] + ((uint)local_38 & 0xfff);
    local_18[4] = local_18[4] + (uint)(local_20 >> 0x24);
    local_18[5] = local_18[5] + (uint)(local_28 >> 0x24);
    local_18[6] = local_18[6] + (uint)(local_30 >> 0x24);
    local_18[7] = local_18[7] + (uint)(local_38 >> 0x24);
    local_18[8] = local_18[8] + ((uint)(local_20 >> 0x18) & 0xfff);
    local_18[9] = local_18[9] + ((uint)(local_28 >> 0x18) & 0xfff);
    local_18[10] = local_18[10] + ((uint)(local_30 >> 0x18) & 0xfff);
    local_18[0xb] = local_18[0xb] + ((uint)(local_38 >> 0x18) & 0xfff);
    local_18[0xc] = local_18[0xc] + ((uint)(local_20 >> 0xc) & 0xfff);
    local_18[0xd] = local_18[0xd] + ((uint)(local_28 >> 0xc) & 0xfff);
    local_18[0xe] = local_18[0xe] + ((uint)(local_30 >> 0xc) & 0xfff);
    local_18[0xf] = local_18[0xf] + ((uint)(local_38 >> 0xc) & 0xfff);
  }
  if (local_c != 0) {
    local_b0 = 0;
    local_b8 = 0;
    do {
      local_b0 = (((ulong)*local_8 & 0x5555) * 0x40010004001 & 0x101010101010101) + local_b0;
      local_b8 = (((ulong)(*local_8 >> 1) & 0x5555) * 0x40010004001 & 0x101010101010101) + local_b8;
      local_c = local_c - 1;
      local_8 = local_8 + 1;
    } while (local_c != 0);
    *local_18 = *local_18 + (int)(local_b0 & 0xff000000ff);
    local_18[8] = local_18[8] + ((uint)(local_b0 >> 8) & 0xff);
    local_18[2] = local_18[2] + ((uint)(local_b0 >> 0x10) & 0xff);
    local_18[10] = local_18[10] + ((uint)(local_b0 >> 0x18) & 0xff);
    local_18[4] = local_18[4] + (int)((local_b0 & 0xff000000ff) >> 0x20);
    local_18[0xc] = local_18[0xc] + ((uint)(local_b0 >> 0x28) & 0xff);
    local_18[6] = local_18[6] + ((ushort)(local_b0 >> 0x30) & 0xff);
    local_18[0xe] = local_18[0xe] + (uint)(byte)(local_b0 >> 0x38);
    local_18[1] = local_18[1] + (int)(local_b8 & 0xff000000ff);
    local_18[9] = local_18[9] + ((uint)(local_b8 >> 8) & 0xff);
    local_18[3] = local_18[3] + ((uint)(local_b8 >> 0x10) & 0xff);
    local_18[0xb] = local_18[0xb] + ((uint)(local_b8 >> 0x18) & 0xff);
    local_18[5] = local_18[5] + (int)((local_b8 & 0xff000000ff) >> 0x20);
    local_18[0xd] = local_18[0xd] + ((uint)(local_b8 >> 0x28) & 0xff);
    local_18[7] = local_18[7] + ((ushort)(local_b8 >> 0x30) & 0xff);
    local_18[0xf] = local_18[0xf] + (uint)(byte)(local_b8 >> 0x38);
  }
  return 0;
}

Assistant:

int pospopcnt_u16_scalar_umul128_unroll2(const uint16_t* in, uint32_t n, uint32_t* out) {
    while (n >= 8) {
        uint64_t counter_a = 0; // 4 packed 12-bit counters
        uint64_t counter_b = 0;
        uint64_t counter_c = 0;
        uint64_t counter_d = 0;

        // end before overflowing the counters
        uint32_t len = ((n < 0x0FFF) ? n : 0x0FFF) & ~7;
        n -= len;
        for (const uint16_t* end = &in[len]; in != end; in += 8) {
            const uint64_t mask_a = UINT64_C(0x1111111111111111);
            const uint64_t mask_b = mask_a + mask_a;
            const uint64_t mask_c = mask_b + mask_b;
            const uint64_t mask_0001 = UINT64_C(0x0001000100010001);
            const uint64_t mask_cnts = UINT64_C(0x000000F00F00F00F);

            uint64_t v0 = pospopcnt_loadu_u64(&in[0]);
            uint64_t v1 = pospopcnt_loadu_u64(&in[4]);

            uint64_t a = (v0 & mask_a) + (v1 & mask_a);
            uint64_t b = ((v0 & mask_b) + (v1 & mask_b)) >> 1;
            uint64_t c = ((v0 & mask_c) + (v1 & mask_c)) >> 2;
            uint64_t d = ((v0 >> 3) & mask_a) + ((v1 >> 3) & mask_a);

            uint64_t hi;
            a = pospopcnt_umul128(a, mask_0001, &hi);
            a += hi; // broadcast 4-bit counts
            b = pospopcnt_umul128(b, mask_0001, &hi);
            b += hi;
            c = pospopcnt_umul128(c, mask_0001, &hi);
            c += hi;
            d = pospopcnt_umul128(d, mask_0001, &hi);
            d += hi;

            counter_a += a & mask_cnts;
            counter_b += b & mask_cnts;
            counter_c += c & mask_cnts;
            counter_d += d & mask_cnts;
        }

        out[0] += counter_a & 0x0FFF;
        out[1] += counter_b & 0x0FFF;
        out[2] += counter_c & 0x0FFF;
        out[3] += counter_d & 0x0FFF;
        out[4] += (counter_a >> 36);
        out[5] += (counter_b >> 36);
        out[6] += (counter_c >> 36);
        out[7] += (counter_d >> 36);
        out[8] += (counter_a >> 24) & 0x0FFF;
        out[9] += (counter_b >> 24) & 0x0FFF;
        out[10] += (counter_c >> 24) & 0x0FFF;
        out[11] += (counter_d >> 24) & 0x0FFF;
        out[12] += (counter_a >> 12) & 0x0FFF;
        out[13] += (counter_b >> 12) & 0x0FFF;
        out[14] += (counter_c >> 12) & 0x0FFF;
        out[15] += (counter_d >> 12) & 0x0FFF;
    }

    // assert(n < 8)
    if (n != 0) {
        uint64_t tail_counter_a = 0;
        uint64_t tail_counter_b = 0;
        do { // zero-extend a bit to 8-bits (emulate pdep) then accumulate
            const uint64_t mask_01 = UINT64_C(0x0101010101010101);
            const uint64_t magic   = UINT64_C(0x0000040010004001); // 1+(1<<14)+(1<<28)+(1<<42)
            uint64_t x = *in++;
            tail_counter_a += ((x & 0x5555) * magic) & mask_01; // 0101010101010101
            tail_counter_b += (((x >> 1) & 0x5555) * magic) & mask_01;
        } while (--n);

        out[0]  += tail_counter_a & 0xFF;
        out[8]  += (tail_counter_a >>  8) & 0xFF;
        out[2]  += (tail_counter_a >> 16) & 0xFF;
        out[10] += (tail_counter_a >> 24) & 0xFF;
        out[4]  += (tail_counter_a >> 32) & 0xFF;
        out[12] += (tail_counter_a >> 40) & 0xFF;
        out[6]  += (tail_counter_a >> 48) & 0xFF;
        out[14] += (tail_counter_a >> 56) & 0xFF;
        out[1]  += tail_counter_b & 0xFF;
        out[9]  += (tail_counter_b >>  8) & 0xFF;
        out[3]  += (tail_counter_b >> 16) & 0xFF;
        out[11] += (tail_counter_b >> 24) & 0xFF;
        out[5]  += (tail_counter_b >> 32) & 0xFF;
        out[13] += (tail_counter_b >> 40) & 0xFF;
        out[7]  += (tail_counter_b >> 48) & 0xFF;
        out[15] += (tail_counter_b >> 56) & 0xFF;
    }

    return 0;
}